

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_char>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  element_type *peVar6;
  bool bVar7;
  idx_t index;
  LogicalType *type;
  Vector *this_00;
  Vector *pVVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  UnifiedVectorFormat sdata;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  element_type *local_78;
  element_type *peStack_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(state_vector,count,&local_c0);
  FlatVector::VerifyFlatVector(result);
  index = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar7 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    iVar11 = 0;
    do {
      iVar13 = iVar11;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)(local_c0.sel)->sel_vector[iVar11];
      }
      plVar17 = (long *)**(long **)(local_c0.data + iVar13 * 8);
      if (plVar17 != (long *)0x0) {
        lVar16 = (ulong)(*(long *)(*(long *)((*(long **)(local_c0.data + iVar13 * 8))[1] + 8) + -8)
                         != 0 && bVar7) + (plVar17[1] - *plVar17) + lVar16;
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  ListVector::Reserve(result,lVar16 + index);
  this_00 = MapVector::GetKeys(result);
  pVVar8 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar2 = result->data;
    pdVar3 = pVVar8->data;
    uVar15 = 0;
    do {
      uVar12 = uVar15;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_c0.sel)->sel_vector[uVar15];
      }
      uVar1 = offset + uVar15;
      plVar17 = *(long **)(local_c0.data + uVar12 * 8);
      plVar14 = (long *)*plVar17;
      if (plVar14 == (long *)0x0) {
        _Var10._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          peVar6 = peStack_70;
          peVar5 = local_78;
          local_78 = (element_type *)0x0;
          peStack_70 = (element_type *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             peStack_70 != (element_type *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var10._M_head_impl;
        }
        bVar4 = (byte)uVar1 & 0x3f;
        _Var10._M_head_impl[uVar1 >> 6] =
             _Var10._M_head_impl[uVar1 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      else {
        *(idx_t *)(pdVar2 + uVar1 * 0x10) = index;
        lVar16 = *plVar14;
        if (plVar14[1] == lVar16) {
          plVar14 = (long *)plVar17[1];
        }
        else {
          uVar12 = 0;
          do {
            this_00->data[uVar12 + index] = *(data_t *)(lVar16 + uVar12);
            plVar14 = (long *)plVar17[1];
            *(undefined8 *)(pdVar3 + uVar12 * 8 + index * 8) =
                 *(undefined8 *)(*plVar14 + uVar12 * 8);
            uVar12 = uVar12 + 1;
            lVar16 = *(long *)*plVar17;
          } while (uVar12 < (ulong)(((long *)*plVar17)[1] - lVar16));
          index = index + uVar12;
        }
        if (bVar7 && *(long *)(plVar14[1] + -8) != 0) {
          OtherBucketValue((Value *)&local_78,&this_00->type);
          Vector::SetValue(this_00,index,(Value *)&local_78);
          Value::~Value((Value *)&local_78);
          *(undefined8 *)(pdVar3 + index * 8) = *(undefined8 *)(*(long *)(plVar17[1] + 8) + -8);
          index = index + 1;
        }
        plVar17 = (long *)(pdVar2 + uVar1 * 0x10);
        plVar17[1] = index - *plVar17;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != count);
  }
  ListVector::SetListSize(result,index);
  Vector::Verify(result,count);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}